

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_exchange.cpp
# Opt level: O0

void libtorrent::aux::ed25519_key_exchange
               (uchar *shared_secret,uchar *public_key,uchar *private_key)

{
  uint uVar1;
  uint local_1a0;
  uint b;
  uint swap;
  int pos;
  fe tmp1;
  i32 local_168 [2];
  fe tmp0;
  i32 local_138 [2];
  fe z3;
  i32 local_108 [2];
  fe x3;
  i32 local_d8 [2];
  fe z2;
  i32 local_a8 [2];
  fe x2;
  i32 local_78 [2];
  fe x1;
  byte local_48 [4];
  uint i;
  uchar e [32];
  uchar *private_key_local;
  uchar *public_key_local;
  uchar *shared_secret_local;
  
  for (x1[9] = 0; (uint)x1[9] < 0x20; x1[9] = x1[9] + 1) {
    local_48[(uint)x1[9]] = private_key[(uint)x1[9]];
  }
  local_48[0] = local_48[0] & 0xf8;
  e[0x17] = e[0x17] & 0x3f | 0x40;
  fe_frombytes(local_78,public_key);
  fe_1((i32 *)&swap);
  fe_add(local_168,local_78,(i32 *)&swap);
  fe_sub((i32 *)&swap,(i32 *)&swap,local_78);
  fe_invert((i32 *)&swap,(i32 *)&swap);
  fe_mul(local_78,local_168,(i32 *)&swap);
  fe_1(local_a8);
  fe_0(local_d8);
  fe_copy(local_108,local_78);
  fe_1(local_138);
  local_1a0 = 0;
  for (b = 0xfe; -1 < (int)b; b = b - 1) {
    uVar1 = (int)(uint)local_48[(int)b / 8] >> ((byte)b & 7) & 1;
    local_1a0 = uVar1 ^ local_1a0;
    fe_cswap(local_a8,local_108,local_1a0);
    fe_cswap(local_d8,local_138,local_1a0);
    fe_sub(local_168,local_108,local_138);
    fe_sub((i32 *)&swap,local_a8,local_d8);
    fe_add(local_a8,local_a8,local_d8);
    fe_add(local_d8,local_108,local_138);
    fe_mul(local_138,local_168,local_a8);
    fe_mul(local_d8,local_d8,(i32 *)&swap);
    fe_sq(local_168,(i32 *)&swap);
    fe_sq((i32 *)&swap,local_a8);
    fe_add(local_108,local_138,local_d8);
    fe_sub(local_d8,local_138,local_d8);
    fe_mul(local_a8,(i32 *)&swap,local_168);
    fe_sub((i32 *)&swap,(i32 *)&swap,local_168);
    fe_sq(local_d8,local_d8);
    fe_mul121666(local_138,(i32 *)&swap);
    fe_sq(local_108,local_108);
    fe_add(local_168,local_168,local_138);
    fe_mul(local_138,local_78,local_d8);
    fe_mul(local_d8,(i32 *)&swap,local_168);
    local_1a0 = uVar1;
  }
  fe_cswap(local_a8,local_108,local_1a0);
  fe_cswap(local_d8,local_138,local_1a0);
  fe_invert(local_d8,local_d8);
  fe_mul(local_a8,local_a8,local_d8);
  fe_tobytes(shared_secret,local_a8);
  return;
}

Assistant:

void ed25519_key_exchange(unsigned char *shared_secret
	, const unsigned char *public_key, const unsigned char *private_key) {
    unsigned char e[32];
    unsigned int i;
    
    fe x1;
    fe x2;
    fe z2;
    fe x3;
    fe z3;
    fe tmp0;
    fe tmp1;

    int pos;
    unsigned int swap;
    unsigned int b;

    /* copy the private key and make sure it's valid */
    for (i = 0; i < 32; ++i) {
        e[i] = private_key[i];
    }

    e[0] &= 248;
    e[31] &= 63;
    e[31] |= 64;

    /* unpack the public key and convert edwards to montgomery */
    /* due to CodesInChaos: montgomeryX = (edwardsY + 1)*inverse(1 - edwardsY) mod p */
    fe_frombytes(x1, public_key);
    fe_1(tmp1);
    fe_add(tmp0, x1, tmp1);
    fe_sub(tmp1, tmp1, x1);
    fe_invert(tmp1, tmp1);
    fe_mul(x1, tmp0, tmp1);

    fe_1(x2);
    fe_0(z2);
    fe_copy(x3, x1);
    fe_1(z3);

    swap = 0;
    for (pos = 254; pos >= 0; --pos) {
        b = e[pos / 8] >> (pos & 7);
        b &= 1;
        swap ^= b;
        fe_cswap(x2, x3, swap);
        fe_cswap(z2, z3, swap);
        swap = b;

        /* from montgomery.h */
        fe_sub(tmp0, x3, z3);
        fe_sub(tmp1, x2, z2);
        fe_add(x2, x2, z2);
        fe_add(z2, x3, z3);
        fe_mul(z3, tmp0, x2);
        fe_mul(z2, z2, tmp1);
        fe_sq(tmp0, tmp1);
        fe_sq(tmp1, x2);
        fe_add(x3, z3, z2);
        fe_sub(z2, z3, z2);
        fe_mul(x2, tmp1, tmp0);
        fe_sub(tmp1, tmp1, tmp0);
        fe_sq(z2, z2);
        fe_mul121666(z3, tmp1);
        fe_sq(x3, x3);
        fe_add(tmp0, tmp0, z3);
        fe_mul(z3, x1, z2);
        fe_mul(z2, tmp1, tmp0);
    }

    fe_cswap(x2, x3, swap);
    fe_cswap(z2, z3, swap);

    fe_invert(z2, z2);
    fe_mul(x2, x2, z2);
    fe_tobytes(shared_secret, x2);
}